

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O3

void __thiscall cmCPackIFWInstaller::GenerateInstallerFile(cmCPackIFWInstaller *this)

{
  pointer pcVar1;
  pointer pbVar2;
  cmCPackIFWGenerator *pcVar3;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  bool bVar4;
  long *plVar5;
  ostream *poVar6;
  size_t length;
  undefined **ppuVar7;
  size_type *psVar8;
  size_type sVar9;
  pointer ppcVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmXMLWriter xout;
  string path;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resources;
  cmGeneratedFileStream fout;
  string local_520;
  cmXMLWriter local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4b0;
  undefined1 local_4a8 [56];
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  string local_430 [3];
  ios_base local_3c0 [264];
  long *local_2b8 [2];
  long local_2a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  cmGeneratedFileStream local_278;
  
  sVar9 = (this->Directory)._M_string_length;
  if (sVar9 == 0) {
    if ((this->super_cmCPackIFWCommon).Generator == (cmCPackIFWGenerator *)0x0) {
      sVar9 = 0;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Directory);
      sVar9 = (this->Directory)._M_string_length;
    }
  }
  paVar12 = &local_430[0].field_2;
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  local_430[0]._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>((string *)local_430,pcVar1,pcVar1 + sVar9);
  std::__cxx11::string::append((char *)local_430);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_430[0]._M_dataplus._M_p,false,None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::cmXMLWriter(&local_500,(ostream *)&local_278,0);
  cmXMLWriter::StartDocument(&local_500,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_500);
  local_430[0]._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Installer","");
  cmXMLWriter::StartElement(&local_500,local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
  local_430[0]._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Name","");
  cmXMLWriter::StartElement(&local_500,local_430);
  cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->Name);
  cmXMLWriter::EndElement(&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
  local_430[0]._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Version","");
  cmXMLWriter::StartElement(&local_500,local_430);
  cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->Version);
  cmXMLWriter::EndElement(&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
  local_430[0]._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Title","");
  cmXMLWriter::StartElement(&local_500,local_430);
  cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->Title);
  cmXMLWriter::EndElement(&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
  if ((this->Publisher)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Publisher","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->Publisher);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->ProductUrl)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"ProductUrl","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->ProductUrl);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->InstallerApplicationIcon)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->InstallerApplicationIcon);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_520,local_430);
    std::__cxx11::string::operator=((string *)local_430,(string *)&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerApplicationIcon,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_520,"InstallerApplicationIcon","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->InstallerWindowIcon)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->InstallerWindowIcon);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerWindowIcon,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"InstallerWindowIcon","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Logo)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->Logo);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->Logo,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Logo","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Banner)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->Banner);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->Banner,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Banner","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Watermark)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->Watermark);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->Watermark,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Watermark","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Background)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->Background);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->Background,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Background","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  paVar12 = &local_430[0].field_2;
  if ((this->WizardStyle)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"WizardStyle","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->WizardStyle);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->WizardDefaultWidth)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"WizardDefaultWidth","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->WizardDefaultWidth);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->WizardDefaultHeight)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"WizardDefaultHeight","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->WizardDefaultHeight);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->TitleColor)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"TitleColor","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->TitleColor);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (!bVar4) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"StartMenuDir","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->StartMenuDir);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetDir)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"TargetDir","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->TargetDir);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->AdminTargetDir)._M_string_length != 0) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"AdminTargetDir","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->AdminTargetDir);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->RemoteRepositories).
      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->RemoteRepositories).
      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"RemoteRepositories","");
    cmXMLWriter::StartElement(&local_500,local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
    ppcVar10 = (this->RemoteRepositories).
               super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar10 !=
        (this->RemoteRepositories).
        super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        cmCPackIFWRepository::WriteRepositoryConfig(*ppcVar10,&local_500);
        ppcVar10 = ppcVar10 + 1;
      } while (ppcVar10 !=
               (this->RemoteRepositories).
               super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    cmXMLWriter::EndElement(&local_500);
  }
  bVar4 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar4) && ((this->MaintenanceToolName)._M_string_length != 0)) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"MaintenanceToolName","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->MaintenanceToolName);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar4) && ((this->MaintenanceToolIniFile)._M_string_length != 0)) {
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"MaintenanceToolIniFile","")
    ;
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->MaintenanceToolIniFile);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (bVar4) {
    cmXMLWriter::Comment(&local_500,"CPack IFW default policy for QtIFW less 2.0");
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_430,"AllowNonAsciiCharacters","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<char[5]>(&local_500,(char (*) [5])0x5cd56f);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != paVar12) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"AllowSpaceInPath","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<char[5]>(&local_500,(char (*) [5])0x5cd56f);
    cmXMLWriter::EndElement(&local_500);
  }
  else {
    if ((this->AllowNonAsciiCharacters)._M_string_length != 0) {
      local_430[0]._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_430,"AllowNonAsciiCharacters","");
      cmXMLWriter::StartElement(&local_500,local_430);
      cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->AllowNonAsciiCharacters);
      cmXMLWriter::EndElement(&local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430[0]._M_dataplus._M_p != paVar12) {
        operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    if ((this->AllowSpaceInPath)._M_string_length == 0) goto LAB_002978dd;
    local_430[0]._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"AllowSpaceInPath","");
    cmXMLWriter::StartElement(&local_500,local_430);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,&this->AllowSpaceInPath);
    cmXMLWriter::EndElement(&local_500);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430[0]._M_dataplus._M_p != paVar12) {
    operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
  }
LAB_002978dd:
  bVar4 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar4) && ((this->ControlScript)._M_string_length != 0)) {
    cmsys::SystemTools::GetFilenameName(local_430,&this->ControlScript);
    paVar12 = &local_520.field_2;
    pcVar1 = (this->Directory)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (this->Directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_520);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_430[0]._M_dataplus._M_p);
    ppuVar7 = (undefined **)(plVar5 + 2);
    if ((undefined **)*plVar5 == ppuVar7) {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._24_8_ = plVar5[3];
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_4a8._16_8_ = *ppuVar7;
      local_4a8._0_8_ = (undefined **)*plVar5;
    }
    local_4a8._8_8_ = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->ControlScript,(string *)local_4a8);
    local_520._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"ControlScript","");
    cmXMLWriter::StartElement(&local_500,&local_520);
    cmXMLWriter::Content<std::__cxx11::string>(&local_500,local_430);
    cmXMLWriter::EndElement(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != paVar12) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
      operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Resources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Resources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCPackIFWResourcesParser::cmCPackIFWResourcesParser
              ((cmCPackIFWResourcesParser *)local_4a8,this);
    local_4b0 = &this->Resources;
    if ((this->Resources).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->Resources).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar11 = 0;
      r = 0;
      do {
        bVar4 = cmCPackIFWResourcesParser::ParseResource((cmCPackIFWResourcesParser *)local_4a8,r);
        if (bVar4) {
          cmsys::SystemTools::GetFilenameName
                    (local_430,
                     (string *)
                     ((long)&(((local_4b0->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar11));
          local_2b8[0] = local_2a8;
          pcVar1 = (this->Directory)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2b8,pcVar1,pcVar1 + (this->Directory)._M_string_length);
          std::__cxx11::string::append((char *)local_2b8);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_2b8,(ulong)local_430[0]._M_dataplus._M_p);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_520.field_2._M_allocated_capacity = *psVar8;
            local_520.field_2._8_8_ = plVar5[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *psVar8;
            local_520._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_520._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_2b8[0] != local_2a8) {
            operator_delete(local_2b8[0],local_2a8[0] + 1);
          }
          cmsys::SystemTools::CopyFileIfDifferent
                    ((string *)
                     ((long)&(((local_4b0->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar11),&local_520);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_298,local_430);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
            operator_delete(local_430[0]._M_dataplus._M_p,
                            local_430[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_430,"Can\'t copy resources from \"",0x1b);
          pbVar2 = (local_4b0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_430,
                              *(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar11),
                              *(long *)((long)&pbVar2->_M_string_length + lVar11));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\". Resource will be skipped.",0x1c);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar3 = (this->super_cmCPackIFWCommon).Generator;
          if (pcVar3 != (cmCPackIFWGenerator *)0x0) {
            this_00 = (pcVar3->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            msg._M_p = local_520._M_dataplus._M_p;
            length = strlen(local_520._M_dataplus._M_p);
            cmCPackLog::Log(this_00,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                            ,0x1ce,msg._M_p,length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
          std::ios_base::~ios_base(local_3c0);
        }
        r = r + 1;
        lVar11 = lVar11 + 0x20;
      } while (r < (ulong)((long)(this->Resources).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Resources).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_4b0,&local_298);
    local_4a8._0_8_ = &PTR__cmCPackIFWResourcesParser_006e9e30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_p != &local_440) {
      operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_p != &local_460) {
      operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
    }
    cmXMLParser::~cmXMLParser((cmXMLParser *)local_4a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
  }
  cmXMLWriter::EndElement(&local_500);
  cmXMLWriter::EndDocument(&local_500);
  cmXMLWriter::~cmXMLWriter(&local_500);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  return;
}

Assistant:

void cmCPackIFWInstaller::GenerateInstallerFile()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Output stream
  cmGeneratedFileStream fout((this->Directory + "/config/config.xml").data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Installer");

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);
  xout.Element("Title", this->Title);

  if (!this->Publisher.empty()) {
    xout.Element("Publisher", this->Publisher);
  }

  if (!this->ProductUrl.empty()) {
    xout.Element("ProductUrl", this->ProductUrl);
  }

  // ApplicationIcon
  if (!this->InstallerApplicationIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerApplicationIcon);
    std::string path = this->Directory + "/config/" + name;
    name = cmSystemTools::GetFilenameWithoutExtension(name);
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerApplicationIcon,
                                            path);
    xout.Element("InstallerApplicationIcon", name);
  }

  // WindowIcon
  if (!this->InstallerWindowIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerWindowIcon);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerWindowIcon, path);
    xout.Element("InstallerWindowIcon", name);
  }

  // Logo
  if (!this->Logo.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Logo);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Logo, path);
    xout.Element("Logo", name);
  }

  // Banner
  if (!this->Banner.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Banner);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Banner, path);
    xout.Element("Banner", name);
  }

  // Watermark
  if (!this->Watermark.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Watermark);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Watermark, path);
    xout.Element("Watermark", name);
  }

  // Background
  if (!this->Background.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Background);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Background, path);
    xout.Element("Background", name);
  }

  // WizardStyle
  if (!this->WizardStyle.empty()) {
    xout.Element("WizardStyle", this->WizardStyle);
  }

  // WizardDefaultWidth
  if (!this->WizardDefaultWidth.empty()) {
    xout.Element("WizardDefaultWidth", this->WizardDefaultWidth);
  }

  // WizardDefaultHeight
  if (!this->WizardDefaultHeight.empty()) {
    xout.Element("WizardDefaultHeight", this->WizardDefaultHeight);
  }

  // TitleColor
  if (!this->TitleColor.empty()) {
    xout.Element("TitleColor", this->TitleColor);
  }

  // Start menu
  if (!this->IsVersionLess("2.0")) {
    xout.Element("StartMenuDir", this->StartMenuDir);
  }

  // Target dir
  if (!this->TargetDir.empty()) {
    xout.Element("TargetDir", this->TargetDir);
  }

  // Admin target dir
  if (!this->AdminTargetDir.empty()) {
    xout.Element("AdminTargetDir", this->AdminTargetDir);
  }

  // Remote repositories
  if (!this->RemoteRepositories.empty()) {
    xout.StartElement("RemoteRepositories");
    for (RepositoriesVector::iterator rit = this->RemoteRepositories.begin();
         rit != this->RemoteRepositories.end(); ++rit) {
      (*rit)->WriteRepositoryConfig(xout);
    }
    xout.EndElement();
  }

  // Maintenance tool
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolName.empty()) {
    xout.Element("MaintenanceToolName", this->MaintenanceToolName);
  }

  // Maintenance tool ini file
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolIniFile.empty()) {
    xout.Element("MaintenanceToolIniFile", this->MaintenanceToolIniFile);
  }

  // Different allows
  if (this->IsVersionLess("2.0")) {
    // CPack IFW default policy
    xout.Comment("CPack IFW default policy for QtIFW less 2.0");
    xout.Element("AllowNonAsciiCharacters", "true");
    xout.Element("AllowSpaceInPath", "true");
  } else {
    if (!this->AllowNonAsciiCharacters.empty()) {
      xout.Element("AllowNonAsciiCharacters", this->AllowNonAsciiCharacters);
    }
    if (!this->AllowSpaceInPath.empty()) {
      xout.Element("AllowSpaceInPath", this->AllowSpaceInPath);
    }
  }

  // Control script (copy to config dir)
  if (!this->IsVersionLess("2.0") && !this->ControlScript.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->ControlScript);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->ControlScript, path);
    xout.Element("ControlScript", name);
  }

  // Resources (copy to resources dir)
  if (!this->Resources.empty()) {
    std::vector<std::string> resources;
    cmCPackIFWResourcesParser parser(this);
    for (size_t i = 0; i < this->Resources.size(); i++) {
      if (parser.ParseResource(i)) {
        std::string name = cmSystemTools::GetFilenameName(this->Resources[i]);
        std::string path = this->Directory + "/resources/" + name;
        cmsys::SystemTools::CopyFileIfDifferent(this->Resources[i], path);
        resources.push_back(name);
      } else {
        cmCPackIFWLogger(WARNING, "Can't copy resources from \""
                           << this->Resources[i]
                           << "\". Resource will be skipped." << std::endl);
      }
    }
    this->Resources = resources;
  }

  xout.EndElement();
  xout.EndDocument();
}